

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneSurrogateCodeUnitsTo
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  undefined4 extraout_var;
  size_t sVar8;
  uint index;
  CharSetNode *pCVar7;
  
  sVar8 = (this->rep).compact.countPlusOne;
  if (sVar8 - 1 < 5) {
    index = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      if (4 < sVar8 - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
        sVar8 = (this->rep).compact.countPlusOne;
      }
      if ((int)sVar8 - 1U <= index) break;
      uVar3 = GetCompactCharU(this,index);
      if ((uVar3 & 0xf800) == 0xd800) {
        SetRange(other,allocator,(Char)uVar3,(Char)uVar3);
      }
      index = index + 1;
      sVar8 = (this->rep).compact.countPlusOne;
    }
  }
  else {
    lVar6 = 2;
    do {
      *(undefined4 *)((long)&other->rep + lVar6 * 4) = *(undefined4 *)((long)&this->rep + lVar6 * 4)
      ;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 10);
    pCVar7 = (this->rep).full.root;
    if (pCVar7 != (CharSetNode *)0x0) {
      iVar4 = (*pCVar7->_vptr_CharSetNode[1])(pCVar7,allocator);
      pCVar7 = (CharSetNode *)CONCAT44(extraout_var,iVar4);
      (other->rep).full.root = pCVar7;
      (*pCVar7->_vptr_CharSetNode[3])(pCVar7,allocator,2,0,0xd7ff,pCVar7->_vptr_CharSetNode[3]);
      return;
    }
    (other->rep).compact.countPlusOne = 0;
  }
  return;
}

Assistant:

void CharSet<char16>::CloneSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<Char>& other)
    {
        if (this->IsCompact())
        {
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                Char c = this->GetCompactChar(i);
                uint uChar = CTU(c);
                if (0xD800 <= uChar && uChar <= 0xDFFF)
                {
                    other.Set(allocator, c);
                }
            }
        }
        else
        {
            other.rep.full.direct.CloneFrom(rep.full.direct);
            if (rep.full.root == nullptr)
            {
                other.rep.full.root = nullptr;
            }
            else
            {
                other.rep.full.root = rep.full.root->Clone(allocator);
                other.rep.full.root->ClearRange(allocator, CharSetNode::levels - 1, 0, 0xD7FF);
            }
        }
    }